

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void namedVariable(Token name,_Bool canAssign)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  byte in_DIL;
  int arg;
  uint8_t setOp;
  uint8_t getOp;
  Token *name_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined1 in_stack_fffffffffffffffc;
  undefined1 in_stack_fffffffffffffffd;
  undefined1 in_stack_fffffffffffffffe;
  
  name_00 = (Token *)&stack0x00000008;
  bVar1 = in_DIL & 1;
  iVar3 = resolveLocal((Compiler *)
                       (CONCAT17(in_DIL,CONCAT16(in_stack_fffffffffffffffe,
                                                 CONCAT15(in_stack_fffffffffffffffd,
                                                          CONCAT14(in_stack_fffffffffffffffc,
                                                                   in_stack_fffffffffffffff8)))) &
                       0x1ffffffffffffff),name_00);
  if ((iVar3 == -1) &&
     (iVar3 = resolveUpvalue((Compiler *)
                             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffffe,
                                                     CONCAT15(in_stack_fffffffffffffffd,
                                                              CONCAT14(in_stack_fffffffffffffffc,
                                                                       0xffffffff)))),name_00),
     iVar3 == -1)) {
    identifierConstant((Token *)0x106c3a);
  }
  if (((bVar1 & 1) == 0) || (_Var2 = match(0x106c5e), !_Var2)) {
    emitBytes('\0','\0');
  }
  else {
    expression();
    emitBytes('\0','\0');
  }
  return;
}

Assistant:

static void namedVariable(Token name, bool canAssign) {
    uint8_t getOp, setOp;
    /**
     * Check if this variable is local first if it is use is
     * else it must be global
     */
    int arg = resolveLocal(current, &name);
    //Check if variable is local
    if (arg != -1) {
        getOp = OP_GET_LOCAL;
        setOp = OP_SET_LOCAL;
    }
    //Check if variable is in local scopes of enclosing functions
    else if ((arg = resolveUpvalue(current, &name)) != -1) {
        getOp = OP_GET_UPVALUE;
        setOp = OP_SET_UPVALUE;
    }
    //Variable now must be global
    else {
        arg = identifierConstant(&name);
        getOp = OP_GET_GLOBAL;
        setOp = OP_SET_GLOBAL;
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(setOp, (uint8_t) arg);
    } else {
        emitBytes(getOp, (uint8_t) arg);
    }
}